

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

Inst * __thiscall mir::inst::PtrOffsetInst::deep_copy(PtrOffsetInst *this)

{
  PtrOffsetInst *this_00;
  VarId local_50;
  VarId local_40;
  Value local_30;
  
  this_00 = (PtrOffsetInst *)operator_new(0x48);
  local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_40.id = (this->super_Inst).dest.id;
  local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_50.id = (this->ptr).id;
  Value::Value(&local_30,&this->offset);
  PtrOffsetInst(this_00,&local_40,&local_50,&local_30);
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new PtrOffsetInst(dest, ptr, offset); }